

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImplicitEventControlSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitEventControlSyntax,slang::syntax::ImplicitEventControlSyntax_const&>
          (BumpAllocator *this,ImplicitEventControlSyntax *args)

{
  undefined4 uVar1;
  ImplicitEventControlSyntax *pIVar2;
  long lVar3;
  ImplicitEventControlSyntax *pIVar4;
  byte bVar5;
  
  bVar5 = 0;
  pIVar2 = (ImplicitEventControlSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitEventControlSyntax *)this->endPtr < pIVar2 + 1) {
    pIVar2 = (ImplicitEventControlSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pIVar2 + 1);
  }
  pIVar4 = pIVar2;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
    (pIVar4->super_TimingControlSyntax).super_SyntaxNode.kind =
         (args->super_TimingControlSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pIVar4->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (ImplicitEventControlSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pIVar4 = (ImplicitEventControlSyntax *)((long)pIVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }